

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_p.h
# Opt level: O0

void __thiscall QStorageInfoPrivate::~QStorageInfoPrivate(QStorageInfoPrivate *this)

{
  QString::~QString((QString *)0x2f5d00);
  QByteArray::~QByteArray((QByteArray *)0x2f5d0e);
  QByteArray::~QByteArray((QByteArray *)0x2f5d1c);
  QByteArray::~QByteArray((QByteArray *)0x2f5d2a);
  QString::~QString((QString *)0x2f5d38);
  return;
}

Assistant:

QStorageInfoPrivate() = default;